

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall QItemSelectionModelPrivate::modelDestroyed(QItemSelectionModelPrivate *this)

{
  long in_RDI;
  QItemSelectionModelPrivate *unaff_retaddr;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *in_stack_00000070;
  
  QPropertyData<QAbstractItemModel_*>::setValueBypassingBindings
            ((QPropertyData<QAbstractItemModel_*> *)(in_RDI + 0x78),(parameter_type)0x0);
  disconnectModel(unaff_retaddr);
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::notify(in_stack_00000070);
  return;
}

Assistant:

void QItemSelectionModelPrivate::modelDestroyed()
{
    model.setValueBypassingBindings(nullptr);
    disconnectModel();
    model.notify();
}